

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_estimateCompressedSize(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  size_t sVar1;
  int local_34;
  ulong uStack_30;
  int s;
  size_t nbBits;
  HUF_CElt *ct;
  uint maxSymbolValue_local;
  uint *count_local;
  HUF_CElt *CTable_local;
  
  uStack_30 = 0;
  for (local_34 = 0; local_34 <= (int)maxSymbolValue; local_34 = local_34 + 1) {
    sVar1 = HUF_getNbBits(CTable[(long)local_34 + 1]);
    uStack_30 = sVar1 * count[local_34] + uStack_30;
  }
  return uStack_30 >> 3;
}

Assistant:

size_t HUF_estimateCompressedSize(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue)
{
    HUF_CElt const* ct = CTable + 1;
    size_t nbBits = 0;
    int s;
    for (s = 0; s <= (int)maxSymbolValue; ++s) {
        nbBits += HUF_getNbBits(ct[s]) * count[s];
    }
    return nbBits >> 3;
}